

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsPartOf_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::IsPartOf_PDU::IsPartOf_PDU(IsPartOf_PDU *this,KDataStream *stream)

{
  KDataStream *stream_local;
  IsPartOf_PDU *this_local;
  
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__IsPartOf_PDU_0032b270;
  DATA_TYPE::RelationshipRecord::RelationshipRecord(&this->m_RelRec);
  DATA_TYPE::Vector::Vector(&this->m_LocPrt);
  DATA_TYPE::NamedLocationIdentifier::NamedLocationIdentifier(&this->m_NmLocID);
  DATA_TYPE::EntityType::EntityType(&this->m_PrtTyp);
  (*(this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6[3])
            (this,stream,0);
  return;
}

Assistant:

IsPartOf_PDU::IsPartOf_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}